

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fighteraxe.cpp
# Opt level: O3

int AF_A_FAxeCheckAtk(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  player_t *player;
  AWeapon *this;
  PClass *pPVar3;
  PClass *pPVar4;
  FState *state;
  char *__assertion;
  undefined8 *puVar5;
  bool bVar6;
  FName local_2c;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005dba6d;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    puVar5 = (undefined8 *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (puVar5 == (undefined8 *)0x0) {
LAB_005db938:
        puVar5 = (undefined8 *)0x0;
      }
      else {
        pPVar4 = (PClass *)puVar5[1];
        if (pPVar4 == (PClass *)0x0) {
          pPVar4 = (PClass *)(**(code **)*puVar5)(puVar5);
          puVar5[1] = pPVar4;
        }
        bVar6 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar3 && bVar6) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar6 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar3) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar6) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005dba6d;
        }
      }
      pPVar3 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005db9f5;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005dba5d;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar4 = (PClass *)puVar2[1];
            if (pPVar4 == (PClass *)0x0) {
              pPVar4 = (PClass *)(**(code **)*puVar2)(puVar2);
              puVar2[1] = pPVar4;
            }
            bVar6 = pPVar4 != (PClass *)0x0;
            if (pPVar4 != pPVar3 && bVar6) {
              do {
                pPVar4 = pPVar4->ParentClass;
                bVar6 = pPVar4 != (PClass *)0x0;
                if (pPVar4 == pPVar3) break;
              } while (pPVar4 != (PClass *)0x0);
            }
            if (!bVar6) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005dba6d;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_005dba5d;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005db9f5:
        player = (player_t *)puVar5[0x40];
        if ((player != (player_t *)0x0) &&
           (this = player->ReadyWeapon, (((this->Ammo1).field_0.p)->super_AInventory).Amount != 0))
        {
          local_2c.Index = FName::NameManager::FindName(&FName::NameData,"FireGlow",false);
          state = AActor::FindState((AActor *)this,&local_2c);
          P_SetPsprite(player,PSP_WEAPON,state,false);
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005dba6d;
    }
    if (puVar5 == (undefined8 *)0x0) goto LAB_005db938;
  }
LAB_005dba5d:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005dba6d:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighteraxe.cpp"
                ,0xb1,"int AF_A_FAxeCheckAtk(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FAxeCheckAtk)
{
	PARAM_ACTION_PROLOGUE;

	player_t *player;

	if (nullptr == (player = self->player))
	{
		return 0;
	}
	if (player->ReadyWeapon->Ammo1->Amount)
	{
		P_SetPsprite(player, PSP_WEAPON, player->ReadyWeapon->FindState ("FireGlow"));
	}
	return 0;
}